

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

bool __thiscall
dg::llvmdg::legacy::GraphBuilder::createPthreadJoin
          (GraphBuilder *this,CallInst *callInst,Block *lastBlock)

{
  Function *llvmFunction_00;
  Function *function;
  undefined8 *puVar1;
  bool bVar2;
  Function *llvmFunction;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> joinFunctions;
  ForkJoinAnalysis FJA;
  undefined8 *local_50;
  undefined8 *local_48;
  long local_40;
  LLVMPointerAnalysis *local_38;
  
  local_38 = this->pointsToAnalysis_;
  dg::ForkJoinAnalysis::joinFunctions((Value *)&local_50);
  bVar2 = false;
  for (puVar1 = local_50; puVar1 != local_48; puVar1 = puVar1 + 1) {
    llvmFunction_00 = (Function *)*puVar1;
    if (*(Function **)(llvmFunction_00 + 0x48) != llvmFunction_00 + 0x48) {
      function = createOrGetFunction(this,llvmFunction_00);
      Block::addJoin(lastBlock,llvmFunction_00,function);
      bVar2 = true;
    }
  }
  if (local_50 != (undefined8 *)0x0) {
    operator_delete(local_50,local_40 - (long)local_50);
  }
  return bVar2;
}

Assistant:

bool GraphBuilder::createPthreadJoin(const llvm::CallInst *callInst,
                                     Block *lastBlock) {
    bool createCallReturn = false;

    // FIXME: create this as attibute so that we perform the analysis only once
    // (now we do not care as we just forward the results of PTA, but in the
    // future...)
    ForkJoinAnalysis FJA{pointsToAnalysis_};
    auto joinFunctions = FJA.joinFunctions(callInst);
    for (const auto *joinFunction : joinFunctions) {
        const auto *llvmFunction = llvm::cast<llvm::Function>(joinFunction);
        if (!llvmFunction->empty()) {
            auto *func = createOrGetFunction(llvmFunction);
            lastBlock->addJoin(llvmFunction, func);
            createCallReturn |= true;
        }
    }
    return createCallReturn;
}